

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh.cxx
# Opt level: O2

void __thiscall xray_re::xr_mesh::load(xr_mesh *this,xr_reader *r,xr_object *object)

{
  uint *puVar1;
  uint32_t *puVar2;
  ushort *puVar3;
  anon_union_24_2_ecfd7102_for_lw_face_0 *paVar4;
  size_t sVar5;
  size_t n;
  ulong uVar6;
  ulong uVar7;
  pointer plVar8;
  uint16_t version;
  
  sVar5 = xr_reader::r_chunk<unsigned_short>(r,0x1000,&version);
  if (sVar5 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                  ,0xe6,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
  }
  if (version != 0x11) {
    __assert_fail("version == EMESH_VERSION",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                  ,0xe7,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
  }
  sVar5 = xr_reader::r_chunk<std::__cxx11::string>(r,0x1001,&this->m_name);
  if (sVar5 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                  ,0xea,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
  }
  sVar5 = xr_reader::r_chunk<xray_re::_aabb<float>>(r,0x1004,&this->m_bbox);
  if (sVar5 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                  ,0xee,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
  }
  sVar5 = xr_reader::r_chunk<unsigned_char>(r,0x1002,&this->m_flags);
  if (sVar5 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                  ,0xf1,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
  }
  xr_reader::r_chunk<xray_re::lw_options>(r,0x1010,&this->m_options);
  sVar5 = xr_reader::find_chunk(r,0x1005);
  if (sVar5 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                  ,0x10a,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
  }
  puVar1 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  xr_reader::r_seq<std::vector<xray_re::_vector3<float>,std::allocator<xray_re::_vector3<float>>>>
            (r,(ulong)*puVar1,&this->m_points);
  sVar5 = xr_reader::find_chunk(r,0x1006);
  if (sVar5 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                  ,0x110,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
  }
  puVar2 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
  xr_reader::r_seq<std::vector<xray_re::lw_face,std::allocator<xray_re::lw_face>>,read_face>
            (r,*puVar2,&this->m_faces);
  sVar5 = xr_reader::find_chunk(r,0x1013);
  if (sVar5 != 0) {
    n = ((long)(this->m_faces).
               super__Vector_base<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>._M_impl.
               super__Vector_impl_data._M_finish -
        (long)(this->m_faces).
              super__Vector_base<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>._M_impl.
              super__Vector_impl_data._M_start) / 0x18;
    if (sVar5 != n * 4) {
      __assert_fail("size == m_faces.size()*sizeof(uint32_t)",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                    ,0x115,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
    }
    xr_reader::r_seq<std::vector<unsigned_int,std::allocator<unsigned_int>>>(r,n,&this->m_sgroups);
  }
  sVar5 = xr_reader::find_chunk(r,0x1008);
  if (sVar5 != 0) {
    puVar2 = (r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
    xr_reader::
    r_seq<std::vector<xray_re::_svector<xray_re::lw_vmref_entry,5u>,std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,5u>>>,read_vmref>
              (r,*puVar2,&this->m_vmrefs);
    sVar5 = xr_reader::find_chunk(r,0x1009);
    if (sVar5 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                    ,0x120,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
    }
    puVar3 = (r->field_2).m_p_u16;
    (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
    xr_reader::
    r_seq<std::vector<xray_re::xr_surfmap*,std::allocator<xray_re::xr_surfmap*>>,read_surfmap>
              (r,(ulong)*puVar3,&this->m_surfmaps,(read_surfmap)object);
    sVar5 = xr_reader::find_chunk(r,0x1012);
    if (sVar5 == 0) {
      sVar5 = xr_reader::find_chunk(r,0x1011);
      if (sVar5 == 0) {
        sVar5 = xr_reader::find_chunk(r,0x1007);
        if (sVar5 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                        ,299,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
        }
        puVar2 = (r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
        xr_reader::
        r_seq<std::vector<xray_re::xr_vmap*,std::allocator<xray_re::xr_vmap*>>,xray_re::xr_vmap::f_read_0>
                  (r,*puVar2,&this->m_vmaps);
      }
      else {
        puVar2 = (r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
        xr_reader::
        r_seq<std::vector<xray_re::xr_vmap*,std::allocator<xray_re::xr_vmap*>>,xray_re::xr_vmap::f_read_1>
                  (r,*puVar2,&this->m_vmaps);
      }
    }
    else {
      puVar2 = (r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
      xr_reader::
      r_seq<std::vector<xray_re::xr_vmap*,std::allocator<xray_re::xr_vmap*>>,xray_re::xr_vmap::f_read_2>
                (r,*puVar2,&this->m_vmaps);
    }
    plVar8 = (this->m_faces).super__Vector_base<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = ((long)(this->m_points).
                   super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->m_points).
                  super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0xc;
    uVar7 = ((long)(this->m_vmrefs).
                   super__Vector_base<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->m_vmrefs).
                  super__Vector_base<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x2c;
    while( true ) {
      if (plVar8 == (this->m_faces).
                    super__Vector_base<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        return;
      }
      if (uVar6 <= (plVar8->field_0).field_0.v[0]) {
        __assert_fail("it->v0 < m_points.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                      ,0x130,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
      }
      if (uVar6 <= (plVar8->field_0).field_0.v[1]) {
        __assert_fail("it->v1 < m_points.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                      ,0x131,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
      }
      if (uVar6 <= (plVar8->field_0).field_0.v[2]) break;
      if (uVar7 <= (plVar8->field_0).field_0.ref[0]) {
        __assert_fail("it->ref0 < m_vmrefs.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                      ,0x133,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
      }
      if (uVar7 <= (plVar8->field_0).field_0.ref[1]) {
        __assert_fail("it->ref1 < m_vmrefs.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                      ,0x134,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
      }
      paVar4 = &plVar8->field_0;
      plVar8 = plVar8 + 1;
      if (uVar7 <= (paVar4->field_0).ref[2]) {
        __assert_fail("it->ref2 < m_vmrefs.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                      ,0x135,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
      }
    }
    __assert_fail("it->v2 < m_points.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                  ,0x132,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                ,0x11b,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
}

Assistant:

void xr_mesh::load(xr_reader& r, xr_object& object)
{
	size_t size;

	uint16_t version;
	if (!r.r_chunk<uint16_t>(EMESH_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == EMESH_VERSION);

	if (!r.r_chunk(EMESH_CHUNK_MESHNAME, m_name))
		xr_not_expected();
	r.debug_find_chunk();

	if (!r.r_chunk<fbox>(EMESH_CHUNK_BBOX, m_bbox))
		xr_not_expected();

	if (!r.r_chunk<uint8_t>(EMESH_CHUNK_FLAGS, m_flags))
		xr_not_expected();

	r.r_chunk<lw_options>(EMESH_CHUNK_OPTIONS, m_options);

#if 0
	if (!(size = r.find_chunk(EMESH_CHUNK_VERTS)))
		xr_not_expected();
	r.r_seq(r.r_u32(), m_points);
//	if (m_flags & EMF_3DSMAX) {
//		xr_assert(m_points.size()*sizeof(fvector3) < size);
	if (m_points.size()*sizeof(fvector3) < size) {
		m_adj_counts.reserve(m_points.size());
		m_adj_refs.reserve(m_points.size());
		while (size) {
			uint8_t n = r.r_u8();
			m_adj_counts.push_back(n);
			xr_assert(size >= n*sizeof(uint32_t) + sizeof(uint8_t));
			size -= n*sizeof(uint32_t) + sizeof(uint8_t)
			while (n--)
				m_adj_refs.push_back(r.r_u32());
		}
	}
	r.debug_find_chunk();
#else
	if (!r.find_chunk(EMESH_CHUNK_VERTS))
		xr_not_expected();
	r.r_seq(r.r_u32(), m_points);
	// adjacency data is ignored by AE/xrECoreB.dll as well
#endif

	if (!r.find_chunk(EMESH_CHUNK_FACES))
		xr_not_expected();
	r.r_seq(r.r_u32(), m_faces, read_face());
	r.debug_find_chunk();

	if ((size = r.find_chunk(EMESH_CHUNK_SG))) {
		xr_assert(size == m_faces.size()*sizeof(uint32_t));
		r.r_seq(m_faces.size(), m_sgroups);
		r.debug_find_chunk();
	}

	if (!r.find_chunk(EMESH_CHUNK_VMREFS))
		xr_not_expected();
	r.r_seq(r.r_u32(), m_vmrefs, read_vmref());
	r.debug_find_chunk();

	if (!r.find_chunk(EMESH_CHUNK_SFACE))
		xr_not_expected();
	r.r_seq(r.r_u16(), m_surfmaps, read_surfmap(object));
	r.debug_find_chunk();

	if (r.find_chunk(EMESH_CHUNK_VMAPS_2)) {
		r.r_seq(r.r_u32(), m_vmaps, xr_vmap::f_read_2());
	} else if (r.find_chunk(EMESH_CHUNK_VMAPS_1)) {
		r.r_seq(r.r_u32(), m_vmaps, xr_vmap::f_read_1());
	} else if (r.find_chunk(EMESH_CHUNK_VMAPS_0)) {
		r.r_seq(r.r_u32(), m_vmaps, xr_vmap::f_read_0());
	} else {
		xr_not_expected();
	}
	r.debug_find_chunk();
#if 1
	for (lw_face_vec_it it = m_faces.begin(); it != m_faces.end(); ++it) {
		xr_assert(it->v0 < m_points.size());
		xr_assert(it->v1 < m_points.size());
		xr_assert(it->v2 < m_points.size());
		xr_assert(it->ref0 < m_vmrefs.size());
		xr_assert(it->ref1 < m_vmrefs.size());
		xr_assert(it->ref2 < m_vmrefs.size());
	}
#endif
}